

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPush(Vec_Str_t *p,char Entry)

{
  int iVar1;
  char Entry_local;
  Vec_Str_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_StrGrow(p,0x10);
    }
    else {
      Vec_StrGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

static inline void Vec_StrPush( Vec_Str_t * p, char Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_StrGrow( p, 16 );
        else
            Vec_StrGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}